

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O3

int64_t __thiscall google::protobuf::io::CordOutputStream::ByteCount(CordOutputStream *this)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(this->cord_).contents_.data_.rep_.field_0.data[0];
  if ((uVar3 & 1) == 0) {
    uVar3 = uVar3 >> 1;
  }
  else {
    uVar3 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
  }
  bVar1 = (this->buffer_).rep_.field_0.short_rep.raw_size;
  if ((bVar1 & 1) == 0) {
    sVar2 = (((this->buffer_).rep_.field_0.long_rep.rep)->super_CordRep).length;
  }
  else {
    sVar2 = (size_t)((char)bVar1 >> 1);
  }
  return sVar2 + uVar3;
}

Assistant:

ABSL_CORD_INTERNAL_NO_SANITIZE
    int8_t tag() const { return reinterpret_cast<const int8_t*>(this)[0]; }